

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

string * cs::process_path(string *raw)

{
  string *str;
  string *in_RSI;
  string *in_RDI;
  size_type pos1;
  size_type pos0;
  fatal_error *this;
  undefined1 local_41 [33];
  long local_20;
  long local_18;
  string *local_10;
  
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::find((char)in_RSI,0x22);
  local_20 = std::__cxx11::string::rfind((char)local_10,0x22);
  if (local_18 == -1) {
    std::__cxx11::string::string((string *)in_RDI,local_10);
  }
  else {
    if (local_18 == local_20) {
      str = (string *)__cxa_allocate_exception(0x28);
      this = (fatal_error *)local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_41 + 1),"argument syntax error.",(allocator *)this);
      fatal_error::fatal_error(this,str);
      __cxa_throw(str,&fatal_error::typeinfo,fatal_error::~fatal_error);
    }
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
  }
  return in_RDI;
}

Assistant:

std::string process_path(const std::string &raw)
	{
		auto pos0 = raw.find('\"');
		auto pos1 = raw.rfind('\"');
		if (pos0 != std::string::npos) {
			if (pos0 == pos1)
				throw cs::fatal_error("argument syntax error.");
			else
				return raw.substr(pos0 + 1, pos1 - pos0 - 1);
		}
		else
			return raw;
	}